

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo.cpp
# Opt level: O3

void __thiscall asmjit::CpuInfo::detect(CpuInfo *this)

{
  byte *pbVar1;
  BitWord *pBVar2;
  undefined1 auVar3 [64];
  char cVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  anon_union_16_2_66d2be9b_for_CpuInfo_9 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  char cVar12;
  uint32_t uVar13;
  uint uVar14;
  ulong uVar15;
  char cVar16;
  uint32_t dw2;
  uint uVar17;
  uint32_t dw1;
  uint uVar18;
  uint uVar19;
  char *pcVar20;
  byte bVar21;
  long lVar22;
  ulong uVar23;
  char *pcVar24;
  uint in_XCR0;
  undefined1 auVar25 [16];
  
  *(undefined8 *)((long)&this->field_9 + 8) = 0;
  lVar22 = 0;
  auVar3 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  *(undefined1 (*) [64])(this->_brandString + 8) = auVar3;
  auVar3 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  this->_archInfo = (ArchInfo)auVar3._0_4_;
  this->_vendorId = auVar3._4_4_;
  this->_family = auVar3._8_4_;
  this->_model = auVar3._12_4_;
  this->_stepping = auVar3._16_4_;
  this->_hwThreadsCount = auVar3._20_4_;
  this->_features = (CpuFeatures)auVar3._24_16_;
  this->_vendorString[0] = auVar3[0x28];
  this->_vendorString[1] = auVar3[0x29];
  this->_vendorString[2] = auVar3[0x2a];
  this->_vendorString[3] = auVar3[0x2b];
  this->_vendorString[4] = auVar3[0x2c];
  this->_vendorString[5] = auVar3[0x2d];
  this->_vendorString[6] = auVar3[0x2e];
  this->_vendorString[7] = auVar3[0x2f];
  this->_vendorString[8] = auVar3[0x30];
  this->_vendorString[9] = auVar3[0x31];
  this->_vendorString[10] = auVar3[0x32];
  this->_vendorString[0xb] = auVar3[0x33];
  this->_vendorString[0xc] = auVar3[0x34];
  this->_vendorString[0xd] = auVar3[0x35];
  this->_vendorString[0xe] = auVar3[0x36];
  this->_vendorString[0xf] = auVar3[0x37];
  this->_brandString[0] = auVar3[0x38];
  this->_brandString[1] = auVar3[0x39];
  this->_brandString[2] = auVar3[0x3a];
  this->_brandString[3] = auVar3[0x3b];
  this->_brandString[4] = auVar3[0x3c];
  this->_brandString[5] = auVar3[0x3d];
  this->_brandString[6] = auVar3[0x3e];
  this->_brandString[7] = auVar3[0x3f];
  ArchInfo::init(&this->_archInfo,(EVP_PKEY_CTX *)0x2);
  *(byte *)(this->_features)._bits = (byte)(this->_features)._bits[0] | 2;
  puVar5 = (uint *)cpuid_basic_info(0);
  uVar14 = *puVar5;
  uVar18 = puVar5[1];
  uVar6 = puVar5[2];
  uVar7 = puVar5[3];
  *(uint *)this->_vendorString = uVar18;
  *(uint *)(this->_vendorString + 4) = uVar6;
  *(uint *)(this->_vendorString + 8) = uVar7;
  do {
    if (((uVar18 == *(uint *)(x86GetCpuVendorID(char_const*)::vendorList + lVar22 + 4)) &&
        (uVar6 == *(uint *)(x86GetCpuVendorID(char_const*)::vendorList + lVar22 + 8))) &&
       (uVar7 == *(uint *)(x86GetCpuVendorID(char_const*)::vendorList + lVar22 + 0xc))) {
      uVar13 = *(uint32_t *)(x86GetCpuVendorID(char_const*)::vendorList + lVar22);
      goto LAB_00169ca8;
    }
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x40);
  uVar13 = 0;
LAB_00169ca8:
  this->_vendorId = uVar13;
  if (uVar14 != 0) {
    puVar5 = (uint *)cpuid_Version_info(1);
    uVar18 = *puVar5;
    uVar6 = puVar5[1];
    uVar7 = puVar5[2];
    uVar8 = puVar5[3];
    uVar19 = uVar18 >> 8 & 0xf;
    uVar17 = uVar18 >> 4 & 0xf;
    this->_family = uVar19;
    this->_model = uVar17;
    this->_stepping = uVar18 & 0xf;
    if (uVar19 == 0xf) {
      this->_family = (uVar18 >> 0x14 & 0xff) + 0xf;
      this->_model = uVar17 | uVar18 >> 0xc & 0xf0;
    }
    auVar25 = vpinsrd_avx(ZEXT416(uVar18 >> 0xc),uVar6,1);
    auVar25 = vpinsrd_avx(auVar25,uVar6 >> 5,2);
    auVar25 = vpinsrd_avx(auVar25,uVar6 >> 0x10,3);
    aVar9 = (anon_union_16_2_66d2be9b_for_CpuInfo_9)vpand_avx(auVar25,_DAT_00181c00);
    this->field_9 = aVar9;
    if ((uVar8 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 3);
      *pbVar1 = *pbVar1 | 0x10;
    }
    if ((uVar8 & 2) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 4);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if ((uVar8 & 8) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 4);
      *pbVar1 = *pbVar1 | 4;
    }
    if ((uVar8 >> 9 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 3);
      *pbVar1 = *pbVar1 | 0x20;
    }
    if ((uVar8 >> 0xd & 1) != 0) {
      *(byte *)(this->_features)._bits = (byte)(this->_features)._bits[0] | 0x80;
    }
    if ((uVar8 >> 0x13 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 3);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if ((uVar8 >> 0x14 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 4);
      *pbVar1 = *pbVar1 | 1;
    }
    if ((uVar8 >> 0x16 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 4);
      *pbVar1 = *pbVar1 | 8;
    }
    if ((uVar8 >> 0x17 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 4);
      *pbVar1 = *pbVar1 | 0x10;
    }
    if ((uVar8 >> 0x19 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 4);
      *pbVar1 = *pbVar1 | 0x40;
    }
    if ((uVar8 >> 0x1a & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 5);
      *pbVar1 = *pbVar1 | 0x20;
    }
    if ((uVar8 >> 0x1b & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 6);
      *pbVar1 = *pbVar1 | 2;
    }
    if ((uVar8 >> 0x1e & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 5);
      *pbVar1 = *pbVar1 | 1;
    }
    if ((uVar7 & 0x10) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    if ((uVar7 & 0x20) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 1);
      *pbVar1 = *pbVar1 | 1;
    }
    if ((uVar7 >> 8 & 1) != 0) {
      *(byte *)(this->_features)._bits = (byte)(this->_features)._bits[0] | 0x40;
    }
    if ((short)uVar7 < 0) {
      *(byte *)(this->_features)._bits = (byte)(this->_features)._bits[0] | 0x20;
    }
    if ((uVar7 >> 0x13 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 1);
      *pbVar1 = *pbVar1 | 8;
    }
    if ((uVar7 >> 0x17 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 2);
      *pbVar1 = *pbVar1 | 0x20;
    }
    if ((uVar7 >> 0x18 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 2);
      *pbVar1 = *pbVar1 | 8;
    }
    if ((uVar7 >> 0x19 & 1) != 0) {
      (this->_features)._bits[0] = (this->_features)._bits[0] | 0x4400000;
    }
    if ((uVar7 >> 0x1a & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_features)._bits + 3);
      *pbVar1 = *pbVar1 | 0xc;
    }
    if ((uVar7 >> 0x1c & 1) != 0) {
      *(byte *)(this->_features)._bits = (byte)(this->_features)._bits[0] | 8;
    }
    uVar18 = 0;
    if (((~uVar8 & 0xc000000) == 0) &&
       (uVar18 = in_XCR0, ((~in_XCR0 & 6) == 0 & (byte)(uVar8 >> 0x1c)) == 1)) {
      uVar15 = 0x24000000000000;
      if ((uVar8 >> 0xc & 1) == 0) {
        uVar15 = 0x4000000000000;
      }
      uVar15 = uVar15 | (this->_features)._bits[0];
      (this->_features)._bits[0] = uVar15;
      if ((uVar8 >> 0x1d & 1) != 0) {
        (this->_features)._bits[0] = uVar15 | 0x10000000000000;
      }
    }
    if (6 < uVar14) {
      lVar22 = cpuid_Extended_Feature_Enumeration_info(7);
      uVar6 = *(uint *)(lVar22 + 4);
      uVar7 = *(uint *)(lVar22 + 8);
      uVar8 = *(uint *)(lVar22 + 0xc);
      if ((uVar6 & 1) != 0) {
        pBVar2 = (this->_features)._bits + 1;
        *(byte *)pBVar2 = (byte)*pBVar2 | 2;
      }
      if ((uVar6 & 8) != 0) {
        pbVar1 = (byte *)((long)(this->_features)._bits + 7);
        *pbVar1 = *pbVar1 | 1;
      }
      if ((uVar6 & 0x10) != 0) {
        pbVar1 = (byte *)((long)(this->_features)._bits + 7);
        *pbVar1 = *pbVar1 | 0x20;
      }
      if ((char)(byte)uVar6 < '\0') {
        pbVar1 = (byte *)((long)(this->_features)._bits + 5);
        *pbVar1 = *pbVar1 | 8;
      }
      if ((uVar6 >> 8 & 1) != 0) {
        pbVar1 = (byte *)((long)(this->_features)._bits + 7);
        *pbVar1 = *pbVar1 | 2;
      }
      if ((uVar6 >> 9 & 1) != 0) {
        pBVar2 = (this->_features)._bits + 1;
        *(byte *)pBVar2 = (byte)*pBVar2 | 1;
      }
      auVar25 = vpbroadcastd_avx512vl();
      auVar25 = vpand_avx(auVar25,_DAT_00181c10);
      auVar11 = vpmovzxdq_avx2(auVar25);
      auVar11 = vpsllvq_avx2(auVar11,_DAT_00181c20);
      auVar25 = vpor_avx(auVar11._0_16_,auVar11._16_16_);
      auVar10 = vpshufd_avx(auVar25,0xee);
      auVar25 = vpor_avx(auVar25,auVar10);
      uVar23 = (ulong)(uVar6 >> 0xb & 0x3000) | (this->_features)._bits[0] |
               (ulong)((uVar8 & 1) << 0x11 | uVar6 >> 7 & 0x8000) |
               (ulong)(uVar6 & 0x100000) << 0x16 | auVar25._0_8_;
      uVar15 = uVar23 | 0x8000000000000000;
      if ((uVar6 & 0x810) == 0) {
        uVar15 = uVar23;
      }
      bVar21 = (byte)uVar6 >> 5 & (uVar15 & 0x4000000000000) != 0;
      if (((uVar6 & 0x810) != 0 || ((uVar8 & 1) != 0 || (uVar6 & 0x21dc0800) != 0)) || (bVar21 != 0)
         ) {
        uVar23 = uVar15 | 0x8000000000000;
        if (bVar21 == 0) {
          uVar23 = uVar15;
        }
        (this->_features)._bits[0] = uVar23;
      }
      if (((~uVar18 & 0xe6) == 0 & (byte)(uVar6 >> 0x10)) == 1) {
        uVar15 = (ulong)((uVar7 & 4) << 10 | uVar8 >> 3 & 0x800 | (uVar8 & 2) << 9 |
                        (uVar6 >> 0x1f) << 8) |
                 (ulong)((uVar6 >> 0x16 & 0x20 |
                         uVar6 >> 0x16 & 0x10 | uVar6 >> 0xc & 0x200 | uVar6 >> 0xb & 0x40) +
                         (uVar6 >> 0x1c & 1) * 8 | uVar6 >> 0x17 & 0x80) |
                 (this->_features)._bits[1];
        (this->_features)._bits[1] = uVar15 | 4;
        if ((uVar7 & 8) != 0) {
          (this->_features)._bits[1] = uVar15 | 0x2004;
        }
      }
      if (0xc < uVar14) {
        puVar5 = (uint *)cpuid_Processor_Extended_States_info(0xd);
        if (((uVar6 >> 0xe & 1) != 0) && ((uVar18 & *puVar5 & 0x18) == 0x18)) {
          pbVar1 = (byte *)((long)(this->_features)._bits + 7);
          *pbVar1 = *pbVar1 | 0x10;
        }
        puVar5 = (uint *)cpuid_Processor_Extended_States_info(0xd);
        uVar14 = *puVar5;
        if ((uVar14 & 1) != 0) {
          pbVar1 = (byte *)((long)(this->_features)._bits + 6);
          *pbVar1 = *pbVar1 | 1;
        }
        if ((uVar14 & 2) != 0) {
          pbVar1 = (byte *)((long)(this->_features)._bits + 5);
          *pbVar1 = *pbVar1 | 0x40;
        }
        if ((uVar14 & 8) != 0) {
          pbVar1 = (byte *)((long)(this->_features)._bits + 5);
          *pbVar1 = *pbVar1 | 0x80;
        }
      }
    }
  }
  pcVar20 = this->_brandString;
  uVar18 = 0x80000000;
  uVar14 = 0x80000000;
  pcVar24 = pcVar20;
  do {
    if (uVar18 == 0) {
      puVar5 = (uint *)cpuid_basic_info(0);
    }
    else if (uVar18 == 1) {
      puVar5 = (uint *)cpuid_Version_info(1);
    }
    else if (uVar18 == 2) {
      puVar5 = (uint *)cpuid_cache_tlb_info(2);
    }
    else if (uVar18 == 3) {
      puVar5 = (uint *)cpuid_serial_info(3);
    }
    else if (uVar18 == 4) {
      puVar5 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
    }
    else if (uVar18 == 5) {
      puVar5 = (uint *)cpuid_MONITOR_MWAIT_Features_info(5);
    }
    else if (uVar18 == 6) {
      puVar5 = (uint *)cpuid_Thermal_Power_Management_info(6);
    }
    else if (uVar18 == 7) {
      puVar5 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
    }
    else if (uVar18 == 9) {
      puVar5 = (uint *)cpuid_Direct_Cache_Access_info(9);
    }
    else if (uVar18 == 10) {
      puVar5 = (uint *)cpuid_Architectural_Performance_Monitoring_info(10);
    }
    else if (uVar18 == 0xb) {
      puVar5 = (uint *)cpuid_Extended_Topology_info(0xb);
    }
    else if (uVar18 == 0xd) {
      puVar5 = (uint *)cpuid_Processor_Extended_States_info(0xd);
    }
    else if (uVar18 == 0xf) {
      puVar5 = (uint *)cpuid_Quality_of_Service_info(0xf);
    }
    else if (uVar18 == 0x80000002) {
      puVar5 = (uint *)cpuid_brand_part1_info(0x80000002);
    }
    else if (uVar18 == 0x80000003) {
      puVar5 = (uint *)cpuid_brand_part2_info(0x80000003);
    }
    else if (uVar18 == 0x80000004) {
      puVar5 = (uint *)cpuid_brand_part3_info(0x80000004);
    }
    else {
      puVar5 = (uint *)cpuid(uVar18);
    }
    uVar6 = *puVar5;
    uVar7 = puVar5[1];
    uVar8 = puVar5[2];
    uVar17 = puVar5[3];
    switch(uVar18) {
    case 0x80000000:
      uVar18 = 0x80000000;
      uVar14 = uVar6;
      if (0x80000007 < uVar6) {
        uVar14 = 0x80000008;
      }
      break;
    case 0x80000001:
      uVar23 = (ulong)((uVar8 & 0x8000000) >> 0x11) |
               (ulong)((uVar8 & 0x200000) >> 1) |
               (ulong)((uVar8 & 0x100000) >> 0x12) | (ulong)(uVar17 & 0x200000) << 0x26 |
               (this->_features)._bits[0] |
               CONCAT44(uVar17,(uVar17 & 1) << 0x12 | uVar8 & 0x400000) & 0x20ffffffff |
               (ulong)((uVar17 & 0x40) << 0x18) | (ulong)(uVar17 & 0x80) << 0x1a |
               (ulong)((uVar17 & 0x100) << 8);
      uVar15 = uVar23 | 0x1400000;
      if ((uVar8 & 0x40000000) == 0) {
        uVar15 = uVar23;
      }
      uVar23 = uVar15 | 0x800000;
      if (((int)uVar8 < 0) ||
         (uVar23 = uVar15,
         (((((uVar17 & 0x2001e1) != 0 || (uVar8 & 0x100000) != 0) || (uVar8 & 0x200000) != 0) ||
          (uVar8 & 0x400000) != 0) || (uVar8 & 0x8000000) != 0) || (uVar8 & 0x40000000) != 0)) {
        uVar15 = uVar23;
        (this->_features)._bits[0] = uVar15;
      }
      if (((uVar15 & 0x4000000000000) != 0) &&
         (uVar15 = uVar15 | (ulong)(uVar17 & 0x10000) << 0x26 | (ulong)(uVar17 & 0x800) << 0x2c,
         (uVar17 & 0x10800) != 0)) {
        (this->_features)._bits[0] = uVar15;
      }
      uVar18 = 0x80000001;
      if ((this->_vendorId == 2) && ((uVar17 & 0x10) != 0)) {
        (this->_features)._bits[0] = uVar15 | 0x10;
      }
      break;
    case 0x80000002:
    case 0x80000003:
    case 0x80000004:
      *(uint *)pcVar24 = uVar6;
      *(uint *)(pcVar24 + 4) = uVar7;
      *(uint *)(pcVar24 + 8) = uVar17;
      *(uint *)(pcVar24 + 0xc) = uVar8;
      pcVar24 = pcVar24 + 0x10;
      if (uVar18 == 0x80000004) {
        uVar18 = 0x80000007;
      }
      break;
    case 0x80000008:
      uVar18 = 0x80000008;
      if ((uVar7 & 1) != 0) {
        pbVar1 = (byte *)((long)(this->_features)._bits + 1);
        *pbVar1 = *pbVar1 | 0x40;
      }
    }
    uVar18 = uVar18 + 1;
  } while (uVar18 <= uVar14);
  pcVar24 = this->_brandString;
  cVar12 = '\0';
LAB_0016a2db:
  cVar16 = cVar12;
  pcVar24 = pcVar24 + 1;
  cVar4 = pcVar24[-1];
  pcVar24[-1] = '\0';
  if (cVar4 == ' ') goto LAB_0016a2f6;
  if (cVar4 == '\0') {
    *pcVar20 = '\0';
    lVar22 = sysconf(0x54);
    uVar13 = 1;
    if (1 < lVar22) {
      uVar13 = (uint32_t)lVar22;
    }
    this->_hwThreadsCount = uVar13;
    return;
  }
  goto LAB_0016a2ec;
LAB_0016a2f6:
  cVar12 = '@';
  if (((cVar16 != '@') && (cVar12 = cVar16, *pcVar24 != ' ')) && (*pcVar24 != '@')) {
LAB_0016a2ec:
    *pcVar20 = cVar4;
    pcVar20 = pcVar20 + 1;
    cVar12 = cVar4;
  }
  goto LAB_0016a2db;
}

Assistant:

ASMJIT_FAVOR_SIZE void CpuInfo::detect() noexcept {
  reset();

#if ASMJIT_ARCH_ARM32 || ASMJIT_ARCH_ARM64
  armDetectCpuInfo(this);
#endif // ASMJIT_ARCH_ARM32 || ASMJIT_ARCH_ARM64

#if ASMJIT_ARCH_X86 || ASMJIT_ARCH_X64
  x86DetectCpuInfo(this);
#endif // ASMJIT_ARCH_X86 || ASMJIT_ARCH_X64

  _hwThreadsCount = cpuDetectHWThreadsCount();
}